

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O1

void __thiscall crnlib::sparse_bit_array::set_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint uVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  
  if (num != 0) {
    if (num == 1) {
      pauVar2 = (undefined1 (*) [16])this->m_ppGroups[index >> 9];
      if (pauVar2 == (undefined1 (*) [16])0x0) {
        pauVar2 = (undefined1 (*) [16])crnlib_malloc(0x40);
        if (pauVar2 == (undefined1 (*) [16])0x0) {
          crnlib_assert("p",
                        "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_sparse_bit_array.h"
                        ,0x95);
        }
        pauVar2[3] = (undefined1  [16])0x0;
        pauVar2[2] = (undefined1  [16])0x0;
        pauVar2[1] = (undefined1  [16])0x0;
        *pauVar2 = (undefined1  [16])0x0;
        this->m_ppGroups[index >> 9] = (uint32 *)pauVar2;
      }
      *(uint *)(*pauVar2 + (index >> 3 & 0x3c)) =
           *(uint *)(*pauVar2 + (index >> 3 & 0x3c)) | 1 << ((byte)index & 0x1f);
    }
    else {
      do {
        if ((0x200 < num) && ((index & 0x1ff) == 0)) {
          do {
            pauVar2 = *(undefined1 (**) [16])((long)this->m_ppGroups + (ulong)(index >> 6));
            if (pauVar2 == (undefined1 (*) [16])0x0) {
              pauVar2 = (undefined1 (*) [16])crnlib_malloc(0x40);
              if (pauVar2 == (undefined1 (*) [16])0x0) {
                crnlib_assert("p",
                              "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_sparse_bit_array.h"
                              ,0x95);
              }
              pauVar2[3] = (undefined1  [16])0x0;
              pauVar2[2] = (undefined1  [16])0x0;
              pauVar2[1] = (undefined1  [16])0x0;
              *pauVar2 = (undefined1  [16])0x0;
              this->m_ppGroups[index >> 9] = (uint32 *)pauVar2;
            }
            *(undefined4 *)pauVar2[3] = 0xffffffff;
            *(undefined4 *)(pauVar2[3] + 4) = 0xffffffff;
            *(undefined4 *)(pauVar2[3] + 8) = 0xffffffff;
            *(undefined4 *)(pauVar2[3] + 0xc) = 0xffffffff;
            *(undefined4 *)pauVar2[2] = 0xffffffff;
            *(undefined4 *)(pauVar2[2] + 4) = 0xffffffff;
            *(undefined4 *)(pauVar2[2] + 8) = 0xffffffff;
            *(undefined4 *)(pauVar2[2] + 0xc) = 0xffffffff;
            *(undefined4 *)pauVar2[1] = 0xffffffff;
            *(undefined4 *)(pauVar2[1] + 4) = 0xffffffff;
            *(undefined4 *)(pauVar2[1] + 8) = 0xffffffff;
            *(undefined4 *)(pauVar2[1] + 0xc) = 0xffffffff;
            *(undefined4 *)*pauVar2 = 0xffffffff;
            *(undefined4 *)(*pauVar2 + 4) = 0xffffffff;
            *(undefined4 *)(*pauVar2 + 8) = 0xffffffff;
            *(undefined4 *)(*pauVar2 + 0xc) = 0xffffffff;
            num = num - 0x200;
            index = index + 0x200;
          } while (0x1ff < num);
          for (; num != 0; num = num - uVar3) {
            pauVar2 = (undefined1 (*) [16])this->m_ppGroups[index >> 9];
            if (pauVar2 == (undefined1 (*) [16])0x0) {
              pauVar2 = (undefined1 (*) [16])crnlib_malloc(0x40);
              if (pauVar2 == (undefined1 (*) [16])0x0) {
                crnlib_assert("p",
                              "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_sparse_bit_array.h"
                              ,0x95);
              }
              pauVar2[3] = (undefined1  [16])0x0;
              pauVar2[2] = (undefined1  [16])0x0;
              pauVar2[1] = (undefined1  [16])0x0;
              *pauVar2 = (undefined1  [16])0x0;
              this->m_ppGroups[index >> 9] = (uint32 *)pauVar2;
            }
            uVar3 = 0x20;
            if (num < 0x20) {
              uVar3 = num;
            }
            *(uint *)(*pauVar2 + (index >> 3 & 0x3c)) =
                 *(uint *)(*pauVar2 + (index >> 3 & 0x3c)) |
                 (0xffffffffU >> (-(char)uVar3 & 0x1fU)) << ((byte)index & 0x1f);
            index = index + uVar3;
          }
          return;
        }
        pauVar2 = (undefined1 (*) [16])this->m_ppGroups[index >> 9];
        if (pauVar2 == (undefined1 (*) [16])0x0) {
          pauVar2 = (undefined1 (*) [16])crnlib_malloc(0x40);
          if (pauVar2 == (undefined1 (*) [16])0x0) {
            crnlib_assert("p",
                          "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_sparse_bit_array.h"
                          ,0x95);
          }
          pauVar2[3] = (undefined1  [16])0x0;
          pauVar2[2] = (undefined1  [16])0x0;
          pauVar2[1] = (undefined1  [16])0x0;
          *pauVar2 = (undefined1  [16])0x0;
          this->m_ppGroups[index >> 9] = (uint32 *)pauVar2;
        }
        uVar3 = 0x20 - (index & 0x1f);
        if (num <= uVar3) {
          uVar3 = num;
        }
        *(uint *)(*pauVar2 + (ulong)((index & 0x1ff) >> 5) * 4) =
             *(uint *)(*pauVar2 + (ulong)((index & 0x1ff) >> 5) * 4) |
             (0xffffffffU >> (-(char)uVar3 & 0x1fU)) << (sbyte)(index & 0x1f);
        uVar1 = uVar3;
        if (num == uVar3) {
          uVar1 = 0;
        }
        index = index + uVar1;
        num = num - uVar3;
      } while (num != 0);
    }
  }
  return;
}

Assistant:

void sparse_bit_array::set_bit_range(uint index, uint num) {
  CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

  if (!num)
    return;
  else if (num == 1) {
    set_bit(index);
    return;
  }

  while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup)) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    const uint group_bit_ofs = index & cBitsPerGroupMask;

    const uint dword_bit_ofs = group_bit_ofs & 31;
    const uint max_bits_to_set = 32 - dword_bit_ofs;

    const uint bits_to_set = math::minimum(max_bits_to_set, num);
    const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

    pGroup[group_bit_ofs >> 5] |= (msk << dword_bit_ofs);

    num -= bits_to_set;
    if (!num)
      return;

    index += bits_to_set;
  }

  while (num >= cBitsPerGroup) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    memset(pGroup, 0xFF, sizeof(uint32) * cDWORDsPerGroup);

    num -= cBitsPerGroup;
    index += cBitsPerGroup;
  }

  while (num) {
    uint group_index = index >> cBitsPerGroupShift;
    CRNLIB_ASSERT(group_index < m_num_groups);

    uint32* pGroup = m_ppGroups[group_index];
    if (!pGroup) {
      pGroup = alloc_group(true);
      m_ppGroups[group_index] = pGroup;
    }

    uint group_bit_ofs = index & cBitsPerGroupMask;

    uint bits_to_set = math::minimum(32U, num);
    uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

    pGroup[group_bit_ofs >> 5] |= (msk << (group_bit_ofs & 31));

    num -= bits_to_set;
    index += bits_to_set;
  }
}